

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_12::CorruptionReporter::~CorruptionReporter(CorruptionReporter *this)

{
  CorruptionReporter *this_local;
  
  ~CorruptionReporter(this);
  operator_delete(this);
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }